

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_it_test.cpp
# Opt level: O0

void __thiscall license::test::strategy_mac_address::test_method(strategy_mac_address *this)

{
  unit_test_log_t *this_00;
  log_level lVar1;
  size_type sVar2;
  lazy_ostream *prev;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[75],_const_char_(&)[75]> local_b0;
  basic_cstring<const_char> local_90;
  begin local_80;
  unit_test_log_t local_62;
  allocator local_61;
  string local_60;
  FUNCTION_RETURN local_2c;
  undefined1 local_28 [4];
  FUNCTION_RETURN result_adapterInfos;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> adapters;
  strategy_mac_address *this_local;
  
  adapters.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::vector
            ((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> *)
             local_28);
  local_2c = os::getAdapterInfos((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                                  *)local_28);
  if ((local_2c == FUNC_RET_BUFFER_TOO_SMALL) || (local_2c == FUNC_RET_OK)) {
    sVar2 = std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::
            size((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> *)
                 local_28);
    if (sVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_60,"strategy_mac_address",&local_61);
      generate_and_verify_license(STRATEGY_ETHERNET,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      goto LAB_00186e71;
    }
  }
  this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/hw_identifier_it_test.cpp"
             ,0x82);
  boost::unit_test::log::begin::begin(&local_80,&local_90,0x44);
  lVar1 = boost::unit_test::unit_test_log_t::operator<<(this_00,&local_80);
  boost::unit_test::unit_test_log_t::operator()(&local_62,lVar1);
  prev = boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            (&local_b0,prev,
             (char (*) [75])
             "No ethernet adapter found skipping testing mac address hardware identifier");
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_62,&local_b0.super_lazy_ostream);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[75],_const_char_(&)[75]>
  ::~lazy_ostream_impl(&local_b0);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_62);
LAB_00186e71:
  std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::~vector
            ((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> *)
             local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(strategy_mac_address) {
	vector<os::OsAdapterInfo> adapters;
	FUNCTION_RETURN result_adapterInfos = os::getAdapterInfos(adapters);
	if ((result_adapterInfos == FUNC_RET_BUFFER_TOO_SMALL || result_adapterInfos == FUNC_RET_OK) &&
		adapters.size() > 0) {
		generate_and_verify_license(LCC_API_HW_IDENTIFICATION_STRATEGY::STRATEGY_ETHERNET, "strategy_mac_address");
	} else {
		BOOST_TEST_MESSAGE("No ethernet adapter found skipping testing mac address hardware identifier");
	}
}